

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O2

void __thiscall MT32Emu::TVP::reset(TVP *this,Part *usePart,PartialParam *usePartialParam)

{
  byte bVar1;
  Bit8u BVar2;
  ushort uVar3;
  Partial *this_00;
  PartialParam *pPVar4;
  ControlROMFeatureSet *pCVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  Bit32s BVar9;
  PatchTemp *pPVar10;
  Poly *pPVar11;
  Synth *pSVar12;
  ControlROMPCMStruct *pCVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  Bit8s BVar17;
  
  this->part = usePart;
  this->partialParam = usePartialParam;
  pPVar10 = Part::getPatchTemp(usePart);
  this->patchTemp = pPVar10;
  pPVar11 = Partial::getPoly(this->partial);
  uVar7 = Poly::getKey(pPVar11);
  uVar8 = uVar7 - 0x3c;
  uVar16 = -uVar8;
  if (0 < (int)uVar8) {
    uVar16 = uVar8;
  }
  sVar6 = -*(short *)(keyToPitchTable + (ulong)uVar16 * 2);
  if (0x3b < uVar7) {
    sVar6 = *(short *)(keyToPitchTable + (ulong)uVar16 * 2);
  }
  pPVar11 = Partial::getPoly(this->partial);
  uVar8 = Poly::getVelocity(pPVar11);
  this_00 = this->partial;
  pPVar4 = this->partialParam;
  pPVar10 = this->patchTemp;
  this->timeElapsed = 0;
  this->processTimerIncrement = 0;
  pSVar12 = Partial::getSynth(this_00);
  pCVar5 = pSVar12->controlROMFeatures;
  iVar14 = (int)((uint)(pPVar4->wg).pitchFine * 0x1000 + -0x32000) / 0x4b0 +
           (int)((uint)(pPVar4->wg).pitchCoarse * 0x1000 + -0x24000) / 0xc +
           ((int)*(short *)(pitchKeyfollowMult + (ulong)(pPVar4->wg).pitchKeyfollow * 2) *
            (int)sVar6 >> 0xd);
  if (((uint)*pCVar5 & 0x20) != 0) {
    iVar14 = iVar14 + (int)((uint)(byte)((pPVar10->patch).keyShift + 0xc) * 0x1000 + -0x24000) / 0xc
    ;
  }
  bVar1 = (pPVar10->patch).fineTune;
  pCVar13 = Partial::getControlROMPCMStruct(this_00);
  if (pCVar13 == (ControlROMPCMStruct *)0x0) {
    uVar16 = (uint)(((pPVar4->wg).waveform & 1) == 0) << 0xc | 0x810d;
  }
  else {
    uVar3._0_1_ = pCVar13->pitchLSB;
    uVar3._1_1_ = pCVar13->pitchMSB;
    uVar16 = (uint)uVar3;
  }
  uVar16 = (int)((uint)bVar1 * 0x1000 + -0x32000) / 0x4b0 + iVar14 + uVar16;
  if (((uint)*pCVar5 & 1) == 0) {
    if ((int)uVar16 < 0) {
      uVar15 = 0;
    }
    else {
      uVar15 = 0xe800;
      if (uVar16 < 0xe800) {
        uVar15 = uVar16;
      }
    }
  }
  else {
    uVar15 = uVar16 & 0xffff;
  }
  this->basePitch = uVar15;
  pPVar4 = this->partialParam;
  BVar9 = calcTargetPitchOffsetWithoutLFO(pPVar4,0,uVar8);
  this->currentPitchOffset = BVar9;
  this->targetPitchOffsetWithoutLFO = BVar9;
  this->phase = 0;
  BVar2 = (pPVar4->pitchEnv).timeKeyfollow;
  BVar17 = (Bit8s)((int)(uVar7 - 0x3c) >> (5 - BVar2 & 0x1f));
  if (BVar2 == '\0') {
    BVar17 = '\0';
  }
  this->timeKeyfollowSubtraction = BVar17;
  this->lfoPitchOffset = 0;
  this->counter = 0;
  this->pitch = (Bit16u)uVar15;
  this->pitchOffsetChangePerBigTick = 0;
  this->targetPitchOffsetReachedBigTick = 0;
  this->shifts = 0;
  return;
}

Assistant:

void TVP::reset(const Part *usePart, const TimbreParam::PartialParam *usePartialParam) {
	part = usePart;
	partialParam = usePartialParam;
	patchTemp = part->getPatchTemp();

	unsigned int key = partial->getPoly()->getKey();
	unsigned int velocity = partial->getPoly()->getVelocity();

	// FIXME: We're using a per-TVP timer instead of a system-wide one for convenience.
	timeElapsed = 0;
	processTimerIncrement = 0;

	basePitch = calcBasePitch(partial, partialParam, patchTemp, key, partial->getSynth()->controlROMFeatures);
	currentPitchOffset = calcTargetPitchOffsetWithoutLFO(partialParam, 0, velocity);
	targetPitchOffsetWithoutLFO = currentPitchOffset;
	phase = 0;

	if (partialParam->pitchEnv.timeKeyfollow) {
		timeKeyfollowSubtraction = Bit32s(key - 60) >> (5 - partialParam->pitchEnv.timeKeyfollow); // PORTABILITY NOTE: Assumes arithmetic shift
	} else {
		timeKeyfollowSubtraction = 0;
	}
	lfoPitchOffset = 0;
	counter = 0;
	pitch = basePitch;

	// These don't really need to be initialised, but it aids debugging.
	pitchOffsetChangePerBigTick = 0;
	targetPitchOffsetReachedBigTick = 0;
	shifts = 0;
}